

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

HierarchyInstantiationSyntax * __thiscall
slang::parsing::Parser::parseHierarchyInstantiation(Parser *this,AttrList attributes)

{
  flat_hash_set<std::string_view> *this_00;
  char *pcVar1;
  group_type_pointer pgVar2;
  long lVar3;
  group_type_pointer pgVar4;
  value_type_pointer pbVar5;
  ulong uVar6;
  int iVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  byte bVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  undefined1 auVar15 [16];
  bool bVar16;
  byte bVar17;
  uint uVar18;
  ParameterValueAssignmentSyntax *parameters;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *phVar19;
  uint64_t uVar20;
  SourceLocation location;
  HierarchicalInstanceSyntax *pHVar21;
  HierarchyInstantiationSyntax *pHVar22;
  ulong uVar23;
  Info *pIVar24;
  Info *extraout_RDX;
  Info *pIVar25;
  TokenKind kind;
  ulong uVar26;
  long lVar27;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *attributes_00;
  ulong pos0;
  unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *set;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_01;
  TokenKind TVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Token TVar31;
  Token TVar32;
  string_view name;
  Token semi;
  Token type;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1a0;
  undefined1 local_190 [16];
  size_t local_180;
  pointer local_178;
  size_t local_170;
  uchar local_168;
  uchar uStack_167;
  uchar uStack_166;
  byte bStack_165;
  uchar uStack_164;
  uchar uStack_163;
  uchar uStack_162;
  byte bStack_161;
  uchar uStack_160;
  uchar uStack_15f;
  uchar uStack_15e;
  byte bStack_15d;
  uchar uStack_15c;
  uchar uStack_15b;
  uchar uStack_15a;
  byte bStack_159;
  char local_158;
  char cStack_157;
  char cStack_156;
  byte bStack_155;
  char cStack_154;
  char cStack_153;
  char cStack_152;
  byte bStack_151;
  char cStack_150;
  char cStack_14f;
  char cStack_14e;
  byte bStack_14d;
  char cStack_14c;
  char cStack_14b;
  char cStack_14a;
  byte bStack_149;
  Token current;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> items;
  
  type = ParserBase::expect(&this->super_ParserBase,Identifier);
  parameters = parseParameterValueAssignment(this);
  name = Token::valueText(&type);
  if ((name._M_len != 0) && (type.kind == Identifier)) {
    this_01 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              (this->moduleDeclStack).
              super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              .data_;
    phVar19 = this_01 + (this->moduleDeclStack).
                        super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        .len * 0x30;
    for (; this_01 != phVar19; this_01 = this_01 + 0x30) {
      uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         (this_01,&name);
      uVar26 = uVar20 >> ((byte)*this_01 & 0x3f);
      lVar27 = (uVar20 & 0xff) * 4;
      cVar8 = (&UNK_004a00ac)[lVar27];
      cVar9 = (&UNK_004a00ad)[lVar27];
      cVar10 = (&UNK_004a00ae)[lVar27];
      bVar11 = (&UNK_004a00af)[lVar27];
      uVar23 = 0;
      do {
        lVar27 = *(long *)(this_01 + 0x10);
        pcVar1 = (char *)(lVar27 + uVar26 * 0x10);
        local_158 = *pcVar1;
        cStack_157 = pcVar1[1];
        cStack_156 = pcVar1[2];
        bStack_155 = pcVar1[3];
        cStack_154 = pcVar1[4];
        cStack_153 = pcVar1[5];
        cStack_152 = pcVar1[6];
        bStack_151 = pcVar1[7];
        cStack_150 = pcVar1[8];
        cStack_14f = pcVar1[9];
        cStack_14e = pcVar1[10];
        bStack_14d = pcVar1[0xb];
        cStack_14c = pcVar1[0xc];
        cStack_14b = pcVar1[0xd];
        cStack_14a = pcVar1[0xe];
        bVar17 = pcVar1[0xf];
        auVar29[0] = -(local_158 == cVar8);
        auVar29[1] = -(cStack_157 == cVar9);
        auVar29[2] = -(cStack_156 == cVar10);
        auVar29[3] = -(bStack_155 == bVar11);
        auVar29[4] = -(cStack_154 == cVar8);
        auVar29[5] = -(cStack_153 == cVar9);
        auVar29[6] = -(cStack_152 == cVar10);
        auVar29[7] = -(bStack_151 == bVar11);
        auVar29[8] = -(cStack_150 == cVar8);
        auVar29[9] = -(cStack_14f == cVar9);
        auVar29[10] = -(cStack_14e == cVar10);
        auVar29[0xb] = -(bStack_14d == bVar11);
        auVar29[0xc] = -(cStack_14c == cVar8);
        auVar29[0xd] = -(cStack_14b == cVar9);
        auVar29[0xe] = -(cStack_14a == cVar10);
        auVar29[0xf] = -(bVar17 == bVar11);
        uVar18 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe);
        bStack_149 = bVar17;
        if (uVar18 != 0) {
          lVar3 = *(long *)(this_01 + 0x18);
          do {
            iVar7 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
              }
            }
            bVar16 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                     operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                                this_01,&name,
                                (basic_string_view<char,_std::char_traits<char>_> *)
                                ((ulong)(uint)(iVar7 << 4) + lVar3 + uVar26 * 0xf0));
            if (bVar16) goto LAB_003d6bf3;
            uVar18 = uVar18 - 1 & uVar18;
          } while (uVar18 != 0);
          bVar17 = *(byte *)(lVar27 + uVar26 * 0x10 + 0xf);
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bVar17) == 0) break;
        lVar27 = uVar26 + uVar23;
        uVar23 = uVar23 + 1;
        uVar26 = lVar27 + 1U & *(ulong *)(this_01 + 8);
      } while (uVar23 <= *(ulong *)(this_01 + 8));
    }
    this_00 = &(this->meta).globalInstances;
    uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this_00
                        ,&name);
    pos0 = uVar20 >> ((byte)(this->meta).globalInstances.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                            .arrays.groups_size_index & 0x3f);
    lVar27 = (uVar20 & 0xff) * 4;
    uVar12 = (&UNK_004a00ac)[lVar27];
    uVar13 = (&UNK_004a00ad)[lVar27];
    uVar14 = (&UNK_004a00ae)[lVar27];
    bVar11 = (&UNK_004a00af)[lVar27];
    uVar26 = 0;
    uVar23 = pos0;
    do {
      pgVar4 = (this->meta).globalInstances.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.groups_;
      pgVar2 = pgVar4 + uVar23;
      local_168 = pgVar2->m[0].n;
      uStack_167 = pgVar2->m[1].n;
      uStack_166 = pgVar2->m[2].n;
      bStack_165 = pgVar2->m[3].n;
      uStack_164 = pgVar2->m[4].n;
      uStack_163 = pgVar2->m[5].n;
      uStack_162 = pgVar2->m[6].n;
      bStack_161 = pgVar2->m[7].n;
      uStack_160 = pgVar2->m[8].n;
      uStack_15f = pgVar2->m[9].n;
      uStack_15e = pgVar2->m[10].n;
      bStack_15d = pgVar2->m[0xb].n;
      uStack_15c = pgVar2->m[0xc].n;
      uStack_15b = pgVar2->m[0xd].n;
      uStack_15a = pgVar2->m[0xe].n;
      bVar17 = pgVar2->m[0xf].n;
      auVar30[0] = -(local_168 == uVar12);
      auVar30[1] = -(uStack_167 == uVar13);
      auVar30[2] = -(uStack_166 == uVar14);
      auVar30[3] = -(bStack_165 == bVar11);
      auVar30[4] = -(uStack_164 == uVar12);
      auVar30[5] = -(uStack_163 == uVar13);
      auVar30[6] = -(uStack_162 == uVar14);
      auVar30[7] = -(bStack_161 == bVar11);
      auVar30[8] = -(uStack_160 == uVar12);
      auVar30[9] = -(uStack_15f == uVar13);
      auVar30[10] = -(uStack_15e == uVar14);
      auVar30[0xb] = -(bStack_15d == bVar11);
      auVar30[0xc] = -(uStack_15c == uVar12);
      auVar30[0xd] = -(uStack_15b == uVar13);
      auVar30[0xe] = -(uStack_15a == uVar14);
      auVar30[0xf] = -(bVar17 == bVar11);
      uVar18 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe);
      bStack_159 = bVar17;
      if (uVar18 != 0) {
        pbVar5 = (this->meta).globalInstances.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                 .arrays.elements_;
        do {
          iVar7 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
            }
          }
          bVar16 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              this_00,&name,
                              (basic_string_view<char,_std::char_traits<char>_> *)
                              ((long)&pbVar5[uVar23 * 0xf]._M_len + (ulong)(uint)(iVar7 << 4)));
          if (bVar16) goto LAB_003d6bf3;
          uVar18 = uVar18 - 1 & uVar18;
        } while (uVar18 != 0);
        bVar17 = pgVar4[uVar23].m[0xf].n;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bVar17) == 0) break;
      uVar6 = (this->meta).globalInstances.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
              .arrays.groups_size_mask;
      lVar27 = uVar23 + uVar26;
      uVar26 = uVar26 + 1;
      uVar23 = lVar27 + 1U & uVar6;
    } while (uVar26 <= uVar6);
    if ((this->meta).globalInstances.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.size <
        (this->meta).globalInstances.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
                ((locator *)&items,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)this_00,pos0,uVar20,&name);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>&>
                ((locator *)&items,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)this_00,uVar20,&name);
    }
  }
LAB_003d6bf3:
  Token::Token(&semi);
  items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 8;
  TVar31 = ParserBase::peek(&this->super_ParserBase);
  current = TVar31;
  bVar16 = slang::syntax::SyntaxFacts::isSemicolon(TVar31.kind);
  if (bVar16) {
    bVar16 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar16) {
      location = Token::location(&current);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x400005,location);
    }
  }
  else {
    bVar16 = slang::syntax::SyntaxFacts::isPossibleInstance(TVar31.kind);
    if (!bVar16) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar31,Semicolon,&semi,(DiagCode)0x400005);
      pIVar25 = extraout_RDX;
      goto LAB_003d6da7;
    }
    do {
      do {
        pIVar25 = TVar31.info;
        pHVar21 = parseHierarchicalInstance(this);
        local_1a0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pHVar21;
        local_190[0] = 1;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_1a0._M_first);
        TVar32 = ParserBase::peek(&this->super_ParserBase);
        bVar16 = slang::syntax::SyntaxFacts::isSemicolon(TVar32.kind);
        if (TVar32.kind != Comma || bVar16) goto LAB_003d6d92;
        local_1a0._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        auVar15[0xf] = 0;
        auVar15._0_15_ = local_190._1_15_;
        local_190 = auVar15 << 8;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_1a0._M_first);
        TVar32 = ParserBase::peek(&this->super_ParserBase);
        pIVar24 = TVar32.info;
        kind = TVar32.kind;
        bVar16 = slang::syntax::SyntaxFacts::isSemicolon(kind);
        if (kind == EndOfFile || bVar16) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          goto LAB_003d6d92;
        }
        TVar28 = TVar31.kind;
        uVar23 = TVar32._0_8_ & 0xffffffff;
        TVar31.info = pIVar24;
        TVar31.kind = (short)uVar23;
        TVar31._2_1_ = (char)(uVar23 >> 0x10);
        TVar31.numFlags.raw = (char)(uVar23 >> 0x18);
        TVar31.rawLen = (int)(uVar23 >> 0x20);
      } while (pIVar25 != pIVar24 || TVar28 != kind);
      bVar16 = ParserBase::
               skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleInstance,&slang::syntax::SyntaxFacts::isSemicolon>
                         (&this->super_ParserBase,(DiagCode)0x400005,true);
      uVar23 = TVar32._0_8_ & 0xffffffff;
      TVar31.kind = (short)uVar23;
      TVar31._2_1_ = (char)(uVar23 >> 0x10);
      TVar31.numFlags.raw = (char)(uVar23 >> 0x18);
      TVar31.rawLen = (int)(uVar23 >> 0x20);
    } while (bVar16);
  }
LAB_003d6d92:
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  pIVar25 = semi.info;
LAB_003d6da7:
  TVar31 = type;
  local_1a0._8_4_ = 1;
  local_190 = (undefined1  [16])0x0;
  local_1a0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_00678c10;
  local_180 = attributes._M_extent._M_extent_value._M_extent_value;
  local_178 = attributes._M_ptr;
  local_170 = attributes._M_extent._M_extent_value._M_extent_value;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
            (&items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar25);
  current.info._0_4_ = 3;
  current._0_8_ = &PTR_getChild_006791b8;
  attributes_00 = &local_1a0;
  pHVar22 = slang::syntax::SyntaxFactory::hierarchyInstantiation
                      (&this->factory,
                       (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                       &attributes_00->_M_first,TVar31,parameters,
                       (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)&current,
                       semi);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)&attributes_00->_M_first);
  return pHVar22;
}

Assistant:

HierarchyInstantiationSyntax& Parser::parseHierarchyInstantiation(AttrList attributes) {
    auto type = expect(TokenKind::Identifier);
    auto parameters = parseParameterValueAssignment();

    // If this is an instantiation of a global module/interface/program,
    // keep track of it in our instantiatedModules set.
    std::string_view name = type.valueText();
    if (!name.empty() && type.kind == TokenKind::Identifier) {
        bool found = false;
        for (auto& set : moduleDeclStack) {
            if (set.find(name) != set.end()) {
                found = true;
                break;
            }
        }
        if (!found)
            meta.globalInstances.emplace(name);
    }

    Token semi;
    SmallVector<TokenOrSyntax, 8> items;
    parseList<isPossibleInstance, isSemicolon>(items, TokenKind::Semicolon, TokenKind::Comma, semi,
                                               RequireItems::True,
                                               diag::ExpectedHierarchicalInstantiation,
                                               [this] { return &parseHierarchicalInstance(); });

    return factory.hierarchyInstantiation(attributes, type, parameters, items.copy(alloc), semi);
}